

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall dap::Deserializer::field<dap::integer>(Deserializer *this,string *name,integer *v)

{
  int iVar1;
  integer *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = &local_30;
  local_10 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:121:22)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(dap::Deserializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:121:22)>
             ::_M_manager;
  local_30 = v;
  iVar1 = (*this->_vptr_Deserializer[10])(this,name,&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return SUB41(iVar1,0);
}

Assistant:

bool Deserializer::field(const std::string& name, T* v) const {
  return this->field(name,
                     [&](const Deserializer* d) { return d->deserialize(v); });
}